

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

uint inthash(uint key)

{
  uint uVar1;
  uint key_local;
  
  uVar1 = (key * 0x1001 >> 0x16 ^ key * 0x1001) * 0x11;
  uVar1 = (uVar1 >> 9 ^ uVar1) * 0x401;
  uVar1 = (uVar1 >> 2 ^ uVar1) * 0x81;
  return uVar1 >> 0xc ^ uVar1;
}

Assistant:

static unsigned int inthash(unsigned int key)
{
    key += (key << 12);
    key ^= (key >> 22);
    key += (key << 4);
    key ^= (key >> 9);
    key += (key << 10);
    key ^= (key >> 2);
    key += (key << 7);
    key ^= (key >> 12);
    return key;
}